

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O0

void __thiscall
kj::Array<kj::Maybe<capnp::Orphan<capnp::compiler::Expression::Param>_>_>::~Array
          (Array<kj::Maybe<capnp::Orphan<capnp::compiler::Expression::Param>_>_> *this)

{
  Array<kj::Maybe<capnp::Orphan<capnp::compiler::Expression::Param>_>_> *this_local;
  
  dispose(this);
  return;
}

Assistant:

inline ~Array() noexcept { dispose(); }